

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O0

void flatbuffers::tests::Offset64ForceAlign(void)

{
  initializer_list<unsigned_char> __l;
  Offset<RootTable> root;
  size_t buffer_minalign;
  Offset<RootTable> root_table_offset;
  allocator<unsigned_char> local_b4;
  uchar local_b3 [3];
  iterator local_b0;
  size_type_conflict local_a8;
  undefined1 local_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  FlatBufferBuilder64 builder;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x400,(Allocator *)0x0,false,buffer_minalign
            );
  local_b3[0] = '\x01';
  local_b3[1] = 2;
  local_b3[2] = 3;
  local_b0 = local_b3;
  local_a8 = 3;
  std::allocator<unsigned_char>::allocator(&local_b4);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,__l,&local_b4);
  std::allocator<unsigned_char>::~allocator(&local_b4);
  root = CreateRootTableDirect
                   ((FlatBufferBuilder64 *)
                    &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,0,(char *)0x0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,(char *)0x0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
                     *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  FinishRootTableBuffer
            ((FlatBufferBuilder64 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,root);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Offset64ForceAlign() {
  FlatBufferBuilder64 builder;

  // Setup some data to serialize that is less than the force_align size of 32
  // bytes.
  std::vector<uint8_t> data{ 1, 2, 3 };

  // Use the CreateDirect which calls the ForceVectorAlign
  const auto root_table_offset =
      CreateRootTableDirect(builder, nullptr, 0, nullptr, nullptr, nullptr,
                            nullptr, nullptr, nullptr, nullptr, &data);

  // Finish the buffer.
  FinishRootTableBuffer(builder, root_table_offset);
}